

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicString.h
# Opt level: O1

int __thiscall
bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>::access
          (DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_> *this,char *__name,
          int __type)

{
  ushort uVar1;
  __uniq_ptr_data<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>,_std::default_delete<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_>,_true,_true>
  this_00;
  subtree_const_ref t;
  int iVar2;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *pvVar3;
  char *pcVar4;
  undefined4 in_register_00000014;
  char *pcVar5;
  char *extraout_RDX;
  char *__name_00;
  ulong uVar6;
  
  pcVar5 = (char *)CONCAT44(in_register_00000014,__type);
  __name_00 = pcVar5;
  uVar6 = (ulong)__name & 0xffffffff;
  while( true ) {
    iVar2 = bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::access
                      ((bt_impl<4096UL,_(bv::allocation_policy_t)0> *)
                       (this->wavelet_tree).
                       super__Vector_base<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>,_std::allocator<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar6]._impl._M_t.
                       super___uniq_ptr_impl<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>,_std::default_delete<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_>_>
                       ,__name_00,(int)pcVar5);
    pvVar3 = &this->child0;
    if ((char)iVar2 != '\0') {
      pvVar3 = &this->child1;
    }
    uVar1 = (pvVar3->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
            super__Vector_impl_data._M_start[uVar6];
    if (this->sigma <= uVar1) break;
    this_00.
    super___uniq_ptr_impl<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>,_std::default_delete<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_*,_std::default_delete<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_>_>
    .super__Head_base<0UL,_bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_*,_false>.
    _M_head_impl = (this->wavelet_tree).
                   super__Vector_base<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>,_std::allocator<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar6]._impl._M_t.
                   super___uniq_ptr_impl<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>,_std::default_delete<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_>_>
    ;
    t._index = 0;
    t._vector = (bt_impl_t *)
                this_00.
                super___uniq_ptr_impl<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>,_std::default_delete<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_*,_std::default_delete<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_>_>
                .
                super__Head_base<0UL,_bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_*,_false>
                ._M_head_impl;
    t._height = *(size_t *)
                 ((long)this_00.
                        super___uniq_ptr_impl<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>,_std::default_delete<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_*,_std::default_delete<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_>_>
                        .
                        super__Head_base<0UL,_bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_*,_false>
                        ._M_head_impl + 0x50);
    t._size = *(size_t *)
               ((long)this_00.
                      super___uniq_ptr_impl<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>,_std::default_delete<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_*,_std::default_delete<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_>_>
                      .
                      super__Head_base<0UL,_bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_*,_false>
                      ._M_head_impl + 0x40);
    t._rank = *(size_t *)
               ((long)this_00.
                      super___uniq_ptr_impl<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>,_std::default_delete<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_*,_std::default_delete<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_>_>
                      .
                      super__Head_base<0UL,_bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_*,_false>
                      ._M_head_impl + 0x48);
    pcVar4 = (char *)bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::getrank
                               ((bt_impl<4096UL,_(bv::allocation_policy_t)0> *)
                                this_00.
                                super___uniq_ptr_impl<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>,_std::default_delete<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_*,_std::default_delete<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_>_>
                                .
                                super__Head_base<0UL,_bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_*,_false>
                                ._M_head_impl,t,(size_t)__name_00,0);
    pcVar5 = extraout_RDX;
    __name_00 = __name_00 + -(long)pcVar4;
    uVar6 = (ulong)uVar1;
    if ((char)iVar2 != '\0') {
      __name_00 = pcVar4;
    }
  }
  return (int)CONCAT11((char)(uVar1 >> 8),(char)uVar1 - this->sigma);
}

Assistant:

inline symbol access(uint node, ulint i){

			bool bit = wavelet_tree[node].access(i);

			uint next_node = (bit==0?child0[node]:child1[node]);

			if(next_node>=sigma)//next node is leaf:return symbol
				return next_node-sigma;

			//else: next_node is a valid address in wavelet_tree

			ulint next_i = wavelet_tree[node].rank(i,bit);

			return access(next_node, next_i);

		}